

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian_opt.cpp
# Opt level: O1

void compute_response_layer_Dyy_top(response_layer *layer,integral_image *iimage)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  float *pfVar6;
  bool *pbVar7;
  float *pfVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  uint uVar12;
  int iVar13;
  int _a_1;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  long lVar24;
  long lVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  uint uVar29;
  int iVar30;
  float *pfVar31;
  int _a;
  int iVar32;
  long lVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int _a_3;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  long lVar52;
  int iVar53;
  int _a_2;
  int iVar54;
  bool *pbVar55;
  long lVar56;
  long lVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  undefined1 auVar72 [16];
  float fVar73;
  float fVar74;
  float fVar75;
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM17 [64];
  undefined1 in_ZMM18 [64];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 in_ZMM22 [64];
  undefined1 in_ZMM23 [64];
  undefined1 in_ZMM24 [64];
  float *local_238;
  float *local_1e0;
  float *local_1c0;
  ulong local_110;
  ulong local_108;
  ulong local_f0;
  float *data;
  
  auVar62 = in_ZMM20._0_16_;
  pfVar6 = layer->response;
  pbVar7 = layer->laplacian;
  iVar1 = iimage->data_width;
  lVar24 = (long)iVar1;
  iVar2 = layer->step;
  lVar25 = (long)iVar2;
  iVar3 = layer->filter_size;
  iVar11 = iVar3 / 3;
  iVar26 = (iVar3 + -1) - (iVar3 + -1 >> 0x1f) >> 1;
  uVar12 = iVar3 / 6;
  iVar4 = layer->width;
  iVar23 = layer->height;
  fVar66 = 1.0 / (float)(iVar3 * iVar3);
  pfVar8 = iimage->data;
  iVar5 = iimage->width;
  if (-6 < iVar3) {
    iVar14 = iVar11 + -1 + iVar1 * iVar26;
    iVar15 = iVar11 + -1 + ((iVar11 + -1) - uVar12) * iVar1;
    iVar28 = 0;
    auVar62 = vxorps_avx512vl(auVar62,auVar62);
    do {
      if (2 < iVar3) {
        iVar43 = iVar28 - iVar11;
        iVar20 = iimage->height;
        iVar21 = iVar43 + 1;
        if (iVar20 < iVar43 + 1) {
          iVar21 = iVar20;
        }
        iVar46 = iVar21 + -1;
        iVar58 = iVar43 + iVar11 * 2;
        if (iVar20 <= iVar58) {
          iVar58 = iVar20;
        }
        iVar16 = iVar58 + -1;
        if (iVar20 < iVar43) {
          iVar43 = iVar20;
        }
        iVar44 = iVar43 + -1;
        iVar40 = iVar20;
        if (iVar28 < iVar20) {
          iVar40 = iVar28;
        }
        iVar47 = iVar40 + -1;
        iVar60 = iVar28 + 1;
        if (iVar20 < iVar28 + 1) {
          iVar60 = iVar20;
        }
        iVar17 = iVar28 + 1 + iVar11;
        if (iVar17 < iVar20) {
          iVar20 = iVar17;
        }
        iVar17 = iVar60 + -1;
        iVar36 = iVar20 + -1;
        lVar52 = (long)((iVar28 / iVar2) * iVar4);
        lVar33 = 0;
        do {
          iVar59 = (int)lVar33;
          iVar48 = iVar59 - iVar26;
          if (iVar5 < iVar59 - iVar26) {
            iVar48 = iVar5;
          }
          iVar18 = (iVar3 - iVar26) + iVar59;
          if (iVar5 <= iVar18) {
            iVar18 = iVar5;
          }
          auVar72 = vfmadd213ss_fma(ZEXT416((uint)pfVar8[iVar15 + iVar59]),
                                    SUB6416(ZEXT464(0xc0400000),0),
                                    ZEXT416((uint)pfVar8[iVar14 + iVar59]));
          fVar67 = 0.0;
          fVar69 = 0.0;
          if ((0 < iVar21) && (0 < iVar48)) {
            fVar69 = pfVar8[iVar46 * iVar1 + iVar48 + -1];
          }
          if ((0 < iVar21) && (0 < iVar18)) {
            fVar67 = pfVar8[iVar46 * iVar1 + iVar18 + -1];
          }
          fVar68 = 0.0;
          fVar70 = 0.0;
          if ((0 < iVar58) && (0 < iVar48)) {
            fVar70 = pfVar8[iVar48 + -1 + iVar16 * iVar1];
          }
          if ((0 < iVar58) && (0 < iVar18)) {
            fVar68 = pfVar8[iVar18 + -1 + iVar16 * iVar1];
          }
          iVar48 = iVar59 - uVar12;
          if (iVar5 < (int)(iVar59 - uVar12)) {
            iVar48 = iVar5;
          }
          iVar18 = (iVar11 - uVar12) + iVar59;
          if (iVar5 <= iVar18) {
            iVar18 = iVar5;
          }
          fVar71 = 0.0;
          if ((0 < iVar21) && (0 < iVar48)) {
            fVar71 = pfVar8[iVar46 * iVar1 + iVar48 + -1];
          }
          fVar73 = 0.0;
          if ((0 < iVar21) && (0 < iVar18)) {
            fVar73 = pfVar8[iVar46 * iVar1 + iVar18 + -1];
          }
          fVar74 = 0.0;
          fVar75 = 0.0;
          if ((0 < iVar58) && (0 < iVar48)) {
            fVar75 = pfVar8[iVar48 + -1 + iVar16 * iVar1];
          }
          if ((0 < iVar58) && (0 < iVar18)) {
            fVar74 = pfVar8[iVar18 + -1 + iVar16 * iVar1];
          }
          auVar9 = vmaxss_avx(ZEXT416((uint)(((fVar69 - fVar67) - fVar70) + fVar68)),
                              ZEXT816(0) << 0x40);
          iVar48 = iVar59 + 1;
          if (iVar5 < iVar59 + 1) {
            iVar48 = iVar5;
          }
          iVar19 = iVar48 + -1;
          iVar18 = iVar59 + 1 + iVar11;
          if (iVar5 <= iVar18) {
            iVar18 = iVar5;
          }
          fVar67 = 0.0;
          auVar63 = vmaxss_avx(ZEXT416((uint)(fVar74 + ((fVar71 - fVar73) - fVar75))),
                               ZEXT816(0) << 0x40);
          auVar9 = vfmadd132ss_fma(auVar63,auVar9,SUB6416(ZEXT464(0xc0400000),0));
          fVar69 = 0.0;
          if ((0 < iVar43) && (0 < iVar48)) {
            fVar69 = pfVar8[iVar44 * iVar1 + iVar19];
          }
          iVar54 = iVar18 + -1;
          if ((0 < iVar43) && (0 < iVar18)) {
            fVar67 = pfVar8[iVar44 * iVar1 + iVar54];
          }
          fVar68 = 0.0;
          fVar70 = 0.0;
          if ((0 < iVar40) && (0 < iVar48)) {
            fVar70 = pfVar8[iVar47 * iVar1 + iVar19];
          }
          if ((0 < iVar40) && (0 < iVar18)) {
            fVar68 = pfVar8[iVar47 * iVar1 + iVar54];
          }
          iVar51 = iVar59 - iVar11;
          if (iVar5 < iVar59 - iVar11) {
            iVar51 = iVar5;
          }
          iVar39 = iVar51 + -1;
          iVar27 = iVar5;
          if (iVar59 < iVar5) {
            iVar27 = iVar59;
          }
          fVar71 = 0.0;
          if ((0 < iVar60) && (0 < iVar51)) {
            fVar71 = pfVar8[iVar17 * iVar1 + iVar39];
          }
          iVar59 = iVar27 + -1;
          fVar73 = 0.0;
          if ((0 < iVar60) && (0 < iVar27)) {
            fVar73 = pfVar8[iVar17 * iVar1 + iVar59];
          }
          fVar74 = 0.0;
          fVar75 = 0.0;
          if ((0 < iVar20) && (0 < iVar51)) {
            fVar75 = pfVar8[iVar36 * iVar1 + iVar39];
          }
          if ((0 < iVar20) && (0 < iVar27)) {
            fVar74 = pfVar8[iVar36 * iVar1 + iVar59];
          }
          auVar63 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
          in_ZMM16 = ZEXT1664(auVar63);
          if ((0 < iVar43) && (0 < iVar51)) {
            in_ZMM16 = ZEXT464((uint)pfVar8[iVar44 * iVar1 + iVar39]);
          }
          auVar63 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
          in_ZMM17 = ZEXT1664(auVar63);
          if ((0 < iVar43) && (0 < iVar27)) {
            in_ZMM17 = ZEXT464((uint)pfVar8[iVar44 * iVar1 + iVar59]);
          }
          auVar63 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
          in_ZMM18 = ZEXT1664(auVar63);
          auVar63 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
          in_ZMM19 = ZEXT1664(auVar63);
          if ((0 < iVar40) && (0 < iVar51)) {
            in_ZMM19 = ZEXT464((uint)pfVar8[iVar39 + iVar47 * iVar1]);
          }
          if ((0 < iVar40) && (0 < iVar27)) {
            in_ZMM18 = ZEXT464((uint)pfVar8[iVar59 + iVar47 * iVar1]);
          }
          auVar63 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
          in_ZMM21 = ZEXT1664(auVar63);
          if ((0 < iVar60) && (0 < iVar48)) {
            in_ZMM21 = ZEXT464((uint)pfVar8[iVar17 * iVar1 + iVar19]);
          }
          auVar63 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
          in_ZMM22 = ZEXT1664(auVar63);
          if ((0 < iVar60) && (0 < iVar18)) {
            in_ZMM22 = ZEXT464((uint)pfVar8[iVar17 * iVar1 + iVar54]);
          }
          auVar63 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
          in_ZMM23 = ZEXT1664(auVar63);
          auVar63 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
          in_ZMM24 = ZEXT1664(auVar63);
          if ((0 < iVar20) && (0 < iVar48)) {
            in_ZMM24 = ZEXT464((uint)pfVar8[iVar19 + iVar36 * iVar1]);
          }
          if ((0 < iVar20) && (0 < iVar18)) {
            in_ZMM23 = ZEXT464((uint)pfVar8[iVar54 + iVar36 * iVar1]);
          }
          auVar63 = vmaxss_avx(ZEXT416((uint)(fVar68 + ((fVar69 - fVar67) - fVar70))),
                               ZEXT816(0) << 0x40);
          auVar10 = vmaxss_avx(ZEXT416((uint)(fVar74 + ((fVar71 - fVar73) - fVar75))),
                               ZEXT816(0) << 0x40);
          auVar64 = vsubss_avx512f(in_ZMM16._0_16_,in_ZMM17._0_16_);
          auVar64 = vsubss_avx512f(auVar64,in_ZMM19._0_16_);
          auVar64 = vaddss_avx512f(auVar64,in_ZMM18._0_16_);
          auVar65 = vmaxss_avx512f(auVar64,auVar62);
          auVar64 = vsubss_avx512f(in_ZMM21._0_16_,in_ZMM22._0_16_);
          auVar64 = vsubss_avx512f(auVar64,in_ZMM24._0_16_);
          auVar64 = vaddss_avx512f(auVar64,in_ZMM23._0_16_);
          auVar64 = vmaxss_avx(auVar64,ZEXT816(0) << 0x40);
          fVar69 = fVar66 * auVar9._0_4_;
          fVar67 = fVar66 * auVar72._0_4_;
          fVar70 = fVar66 * (((auVar63._0_4_ + auVar10._0_4_) - auVar65._0_4_) - auVar64._0_4_);
          auVar72 = vfmadd231ss_fma(ZEXT416((uint)(fVar70 * fVar70 * -0.81)),ZEXT416((uint)fVar69),
                                    ZEXT416((uint)fVar67));
          pfVar6[lVar52] = auVar72._0_4_;
          pbVar7[lVar52] = 0.0 <= fVar67 + fVar69;
          lVar52 = lVar52 + 1;
          lVar33 = lVar33 + lVar25;
        } while (lVar33 < iVar11);
      }
      iVar28 = iVar28 + iVar2;
      iVar14 = iVar14 + iVar2 * iVar1;
      iVar15 = iVar15 + iVar2 * iVar1;
    } while (iVar28 <= (int)uVar12);
  }
  iVar15 = uVar12 + iVar2;
  uVar29 = iVar15 % iVar2;
  iVar14 = iVar15 - uVar29;
  if (iVar14 <= iVar26) {
    iVar20 = iVar11 + -1 + ((iVar26 + iVar15) - uVar29) * iVar1;
    iVar58 = iVar2 * iVar1;
    iVar21 = iVar11 + -1 + ((iVar15 + iVar11 + ~uVar29) - uVar12) * iVar1;
    iVar43 = iVar11 + -1 + ((~uVar29 + iVar15) - uVar12) * iVar1;
    auVar62 = vxorps_avx512vl(auVar62,auVar62);
    iVar28 = iVar14;
    do {
      if (2 < iVar3) {
        iVar44 = (iVar28 / iVar2) * iVar4;
        iVar40 = iVar28 - iVar11;
        iVar46 = iimage->height;
        iVar16 = iVar40 + 1;
        if (iVar46 < iVar40 + 1) {
          iVar16 = iVar46;
        }
        iVar47 = iVar16 + -1;
        iVar60 = iVar40 + iVar11 * 2;
        if (iVar46 <= iVar60) {
          iVar60 = iVar46;
        }
        iVar17 = iVar60 + -1;
        if (iVar46 < iVar40) {
          iVar40 = iVar46;
        }
        iVar59 = iVar40 + -1;
        iVar36 = iVar46;
        if (iVar28 < iVar46) {
          iVar36 = iVar28;
        }
        iVar18 = iVar36 + -1;
        iVar48 = iVar28 + 1;
        if (iVar46 < iVar28 + 1) {
          iVar48 = iVar46;
        }
        iVar19 = iVar28 + 1 + iVar11;
        if (iVar19 < iVar46) {
          iVar46 = iVar19;
        }
        iVar19 = iVar48 + -1;
        iVar54 = iVar46 + -1;
        pfVar31 = pfVar6 + iVar44;
        pbVar55 = pbVar7 + iVar44;
        lVar33 = 0;
        do {
          iVar44 = (int)lVar33;
          iVar51 = iVar44 - iVar26;
          if (iVar5 < iVar44 - iVar26) {
            iVar51 = iVar5;
          }
          iVar27 = (iVar3 - iVar26) + iVar44;
          if (iVar5 <= iVar27) {
            iVar27 = iVar5;
          }
          auVar72 = vfmadd213ss_fma(ZEXT416((uint)(pfVar8[iVar21 + iVar44] - pfVar8[iVar43 + iVar44]
                                                  )),SUB6416(ZEXT464(0xc0400000),0),
                                    ZEXT416((uint)pfVar8[iVar20 + iVar44]));
          fVar67 = 0.0;
          fVar69 = 0.0;
          if ((0 < iVar16) && (0 < iVar51)) {
            fVar69 = pfVar8[iVar47 * iVar1 + iVar51 + -1];
          }
          if ((0 < iVar16) && (0 < iVar27)) {
            fVar67 = pfVar8[iVar47 * iVar1 + iVar27 + -1];
          }
          fVar68 = 0.0;
          fVar70 = 0.0;
          if ((0 < iVar60) && (0 < iVar51)) {
            fVar70 = pfVar8[iVar51 + -1 + iVar17 * iVar1];
          }
          if ((0 < iVar60) && (0 < iVar27)) {
            fVar68 = pfVar8[iVar27 + -1 + iVar17 * iVar1];
          }
          iVar51 = iVar44 - uVar12;
          if (iVar5 < (int)(iVar44 - uVar12)) {
            iVar51 = iVar5;
          }
          iVar27 = (iVar11 - uVar12) + iVar44;
          if (iVar5 <= iVar27) {
            iVar27 = iVar5;
          }
          fVar71 = 0.0;
          if ((0 < iVar16) && (0 < iVar51)) {
            fVar71 = pfVar8[iVar47 * iVar1 + iVar51 + -1];
          }
          fVar73 = 0.0;
          if ((0 < iVar16) && (0 < iVar27)) {
            fVar73 = pfVar8[iVar47 * iVar1 + iVar27 + -1];
          }
          fVar74 = 0.0;
          fVar75 = 0.0;
          if ((0 < iVar60) && (0 < iVar51)) {
            fVar75 = pfVar8[iVar51 + -1 + iVar17 * iVar1];
          }
          if ((0 < iVar60) && (0 < iVar27)) {
            fVar74 = pfVar8[iVar27 + -1 + iVar17 * iVar1];
          }
          auVar9 = vmaxss_avx(ZEXT416((uint)(((fVar69 - fVar67) - fVar70) + fVar68)),
                              ZEXT816(0) << 0x40);
          iVar51 = iVar44 + 1;
          if (iVar5 < iVar44 + 1) {
            iVar51 = iVar5;
          }
          iVar39 = iVar51 + -1;
          iVar27 = iVar44 + 1 + iVar11;
          if (iVar5 <= iVar27) {
            iVar27 = iVar5;
          }
          fVar67 = 0.0;
          auVar63 = vmaxss_avx(ZEXT416((uint)(fVar74 + ((fVar71 - fVar73) - fVar75))),
                               ZEXT816(0) << 0x40);
          auVar9 = vfmadd132ss_fma(auVar63,auVar9,SUB6416(ZEXT464(0xc0400000),0));
          fVar69 = 0.0;
          if ((0 < iVar40) && (0 < iVar51)) {
            fVar69 = pfVar8[iVar59 * iVar1 + iVar39];
          }
          iVar34 = iVar27 + -1;
          if ((0 < iVar40) && (0 < iVar27)) {
            fVar67 = pfVar8[iVar59 * iVar1 + iVar34];
          }
          fVar68 = 0.0;
          fVar70 = 0.0;
          if ((0 < iVar36) && (0 < iVar51)) {
            fVar70 = pfVar8[iVar18 * iVar1 + iVar39];
          }
          if ((0 < iVar36) && (0 < iVar27)) {
            fVar68 = pfVar8[iVar18 * iVar1 + iVar34];
          }
          iVar61 = iVar44 - iVar11;
          if (iVar5 < iVar44 - iVar11) {
            iVar61 = iVar5;
          }
          iVar45 = iVar61 + -1;
          iVar41 = iVar5;
          if (iVar44 < iVar5) {
            iVar41 = iVar44;
          }
          fVar71 = 0.0;
          if ((0 < iVar48) && (0 < iVar61)) {
            fVar71 = pfVar8[iVar19 * iVar1 + iVar45];
          }
          iVar44 = iVar41 + -1;
          fVar73 = 0.0;
          if ((0 < iVar48) && (0 < iVar41)) {
            fVar73 = pfVar8[iVar19 * iVar1 + iVar44];
          }
          fVar74 = 0.0;
          fVar75 = 0.0;
          if ((0 < iVar46) && (0 < iVar61)) {
            fVar75 = pfVar8[iVar54 * iVar1 + iVar45];
          }
          if ((0 < iVar46) && (0 < iVar41)) {
            fVar74 = pfVar8[iVar54 * iVar1 + iVar44];
          }
          auVar63 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
          in_ZMM16 = ZEXT1664(auVar63);
          if ((0 < iVar40) && (0 < iVar61)) {
            in_ZMM16 = ZEXT464((uint)pfVar8[iVar59 * iVar1 + iVar45]);
          }
          auVar63 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
          in_ZMM17 = ZEXT1664(auVar63);
          if ((0 < iVar40) && (0 < iVar41)) {
            in_ZMM17 = ZEXT464((uint)pfVar8[iVar59 * iVar1 + iVar44]);
          }
          auVar63 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
          in_ZMM18 = ZEXT1664(auVar63);
          auVar63 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
          in_ZMM19 = ZEXT1664(auVar63);
          if ((0 < iVar36) && (0 < iVar61)) {
            in_ZMM19 = ZEXT464((uint)pfVar8[iVar45 + iVar18 * iVar1]);
          }
          if ((0 < iVar36) && (0 < iVar41)) {
            in_ZMM18 = ZEXT464((uint)pfVar8[iVar44 + iVar18 * iVar1]);
          }
          auVar63 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
          in_ZMM21 = ZEXT1664(auVar63);
          if ((0 < iVar48) && (0 < iVar51)) {
            in_ZMM21 = ZEXT464((uint)pfVar8[iVar19 * iVar1 + iVar39]);
          }
          auVar63 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
          in_ZMM22 = ZEXT1664(auVar63);
          if ((0 < iVar48) && (0 < iVar27)) {
            in_ZMM22 = ZEXT464((uint)pfVar8[iVar19 * iVar1 + iVar34]);
          }
          auVar63 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
          in_ZMM23 = ZEXT1664(auVar63);
          auVar63 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
          in_ZMM24 = ZEXT1664(auVar63);
          if ((0 < iVar46) && (0 < iVar51)) {
            in_ZMM24 = ZEXT464((uint)pfVar8[iVar39 + iVar54 * iVar1]);
          }
          if ((0 < iVar46) && (0 < iVar27)) {
            in_ZMM23 = ZEXT464((uint)pfVar8[iVar34 + iVar54 * iVar1]);
          }
          auVar63 = vmaxss_avx(ZEXT416((uint)(fVar68 + ((fVar69 - fVar67) - fVar70))),
                               ZEXT816(0) << 0x40);
          auVar10 = vmaxss_avx(ZEXT416((uint)(fVar74 + ((fVar71 - fVar73) - fVar75))),
                               ZEXT816(0) << 0x40);
          auVar64 = vsubss_avx512f(in_ZMM16._0_16_,in_ZMM17._0_16_);
          auVar64 = vsubss_avx512f(auVar64,in_ZMM19._0_16_);
          auVar64 = vaddss_avx512f(auVar64,in_ZMM18._0_16_);
          auVar65 = vmaxss_avx512f(auVar64,auVar62);
          auVar64 = vsubss_avx512f(in_ZMM21._0_16_,in_ZMM22._0_16_);
          auVar64 = vsubss_avx512f(auVar64,in_ZMM24._0_16_);
          auVar64 = vaddss_avx512f(auVar64,in_ZMM23._0_16_);
          auVar64 = vmaxss_avx(auVar64,ZEXT816(0) << 0x40);
          fVar69 = fVar66 * auVar9._0_4_;
          fVar67 = fVar66 * auVar72._0_4_;
          fVar70 = fVar66 * (((auVar63._0_4_ + auVar10._0_4_) - auVar65._0_4_) - auVar64._0_4_);
          auVar72 = vfmadd231ss_fma(ZEXT416((uint)(fVar70 * fVar70 * -0.81)),ZEXT416((uint)fVar69),
                                    ZEXT416((uint)fVar67));
          *pfVar31 = auVar72._0_4_;
          *pbVar55 = 0.0 <= fVar67 + fVar69;
          lVar33 = lVar33 + lVar25;
          pfVar31 = pfVar31 + 1;
          pbVar55 = pbVar55 + 1;
        } while (lVar33 < iVar11);
      }
      iVar28 = iVar28 + iVar2;
      iVar20 = iVar20 + iVar58;
      iVar21 = iVar21 + iVar58;
      iVar43 = iVar43 + iVar58;
    } while (iVar28 <= iVar26);
  }
  iVar28 = (iVar11 + -1 + iVar2) / iVar2;
  iVar20 = iVar28 * iVar2;
  if (-6 < iVar3) {
    iVar58 = iVar4 * iVar2 - iVar11;
    lVar33 = (long)iVar20;
    iVar43 = ((iVar11 + -1) - uVar12) * iVar1;
    local_1e0 = pfVar8 + ((lVar24 * iVar26 + lVar33) - (long)iVar11);
    iVar21 = iVar11 + -1 + iVar43;
    local_110 = 0;
    auVar62 = vxorps_avx512vl(auVar62,auVar62);
    do {
      if (iVar20 <= iVar58) {
        iVar60 = (int)local_110;
        iVar44 = (int)((long)((ulong)(uint)(iVar60 >> 0x1f) << 0x20 | local_110 & 0xffffffff) /
                      (long)iVar2) * iVar4 + iVar28;
        iVar16 = iVar60 - iVar11;
        iVar46 = iimage->height;
        iVar40 = iVar16 + 1;
        if (iVar46 < iVar16 + 1) {
          iVar40 = iVar46;
        }
        iVar17 = iVar40 + -1;
        iVar47 = iVar11 * 2 + iVar16;
        if (iVar46 <= iVar47) {
          iVar47 = iVar46;
        }
        iVar36 = iVar47 + -1;
        if (iVar46 < iVar16) {
          iVar16 = iVar46;
        }
        iVar48 = iVar16 + -1;
        iVar59 = iVar46;
        if (iVar60 < iVar46) {
          iVar59 = iVar60;
        }
        iVar19 = iVar59 + -1;
        iVar18 = iVar60 + 1;
        if (iVar46 < iVar60 + 1) {
          iVar18 = iVar46;
        }
        iVar60 = iVar11 + 1 + iVar60;
        if (iVar60 < iVar46) {
          iVar46 = iVar60;
        }
        iVar41 = iVar18 + -1;
        iVar45 = iVar46 + -1;
        pfVar31 = pfVar6 + iVar44;
        pbVar55 = pbVar7 + iVar44;
        lVar52 = 0;
        iVar61 = iVar11 - uVar12;
        iVar44 = iVar21;
        iVar60 = iVar11 + -1;
        iVar54 = iVar3 - iVar26;
        iVar51 = -iVar26;
        iVar27 = iVar11 + 1;
        iVar39 = -iVar11;
        iVar34 = -uVar12;
        do {
          iVar35 = iVar20 + iVar51;
          if (iVar5 < iVar20 + iVar51) {
            iVar35 = iVar5;
          }
          iVar30 = iVar20 + iVar54;
          if (iVar5 <= iVar20 + iVar54) {
            iVar30 = iVar5;
          }
          auVar72 = vfmadd132ss_fma(ZEXT416((uint)(pfVar8[iVar20 + iVar44] -
                                                  pfVar8[(lVar33 + iVar43 + lVar52) - (long)iVar11])
                                           ),ZEXT416((uint)(pfVar8[((long)iVar26 + local_110) *
                                                                   lVar24 + (long)(iVar20 + iVar60)]
                                                           - local_1e0[lVar52])),
                                    SUB6416(ZEXT464(0xc0400000),0));
          fVar67 = 0.0;
          fVar69 = 0.0;
          if ((0 < iVar40) && (fVar69 = 0.0, 0 < iVar35)) {
            fVar69 = pfVar8[iVar17 * iVar1 + iVar35 + -1];
          }
          if ((0 < iVar40) && (0 < iVar30)) {
            fVar67 = pfVar8[iVar17 * iVar1 + iVar30 + -1];
          }
          fVar68 = 0.0;
          fVar70 = 0.0;
          if ((0 < iVar47) && (0 < iVar35)) {
            fVar70 = pfVar8[iVar35 + -1 + iVar36 * iVar1];
          }
          if ((0 < iVar47) && (0 < iVar30)) {
            fVar68 = pfVar8[iVar30 + -1 + iVar36 * iVar1];
          }
          iVar35 = iVar20 + iVar34;
          if (iVar5 < iVar20 + iVar34) {
            iVar35 = iVar5;
          }
          iVar30 = iVar20 + iVar61;
          if (iVar5 <= iVar20 + iVar61) {
            iVar30 = iVar5;
          }
          fVar71 = 0.0;
          if ((0 < iVar40) && (0 < iVar35)) {
            fVar71 = pfVar8[iVar17 * iVar1 + iVar35 + -1];
          }
          fVar73 = 0.0;
          if ((0 < iVar40) && (0 < iVar30)) {
            fVar73 = pfVar8[iVar17 * iVar1 + iVar30 + -1];
          }
          fVar74 = 0.0;
          fVar75 = 0.0;
          if ((0 < iVar47) && (0 < iVar35)) {
            fVar75 = pfVar8[iVar35 + -1 + iVar36 * iVar1];
          }
          if ((0 < iVar47) && (0 < iVar30)) {
            fVar74 = pfVar8[iVar30 + -1 + iVar36 * iVar1];
          }
          auVar9 = vmaxss_avx(ZEXT416((uint)(((fVar69 - fVar67) - fVar70) + fVar68)),
                              ZEXT816(0) << 0x40);
          iVar35 = iVar20 + 1 + (int)lVar52;
          if (iVar5 < iVar35) {
            iVar35 = iVar5;
          }
          iVar32 = iVar35 + -1;
          iVar30 = iVar20 + iVar27;
          if (iVar5 <= iVar20 + iVar27) {
            iVar30 = iVar5;
          }
          fVar67 = 0.0;
          auVar63 = vmaxss_avx(ZEXT416((uint)(fVar74 + ((fVar71 - fVar73) - fVar75))),
                               ZEXT816(0) << 0x40);
          auVar9 = vfmadd132ss_fma(auVar63,auVar9,SUB6416(ZEXT464(0xc0400000),0));
          fVar69 = 0.0;
          if ((0 < iVar16) && (0 < iVar35)) {
            fVar69 = pfVar8[iVar48 * iVar1 + iVar32];
          }
          iVar42 = iVar30 + -1;
          if ((0 < iVar16) && (0 < iVar30)) {
            fVar67 = pfVar8[iVar48 * iVar1 + iVar42];
          }
          fVar68 = 0.0;
          fVar70 = 0.0;
          if ((0 < iVar59) && (0 < iVar35)) {
            fVar70 = pfVar8[iVar19 * iVar1 + iVar32];
          }
          if ((0 < iVar59) && (0 < iVar30)) {
            fVar68 = pfVar8[iVar19 * iVar1 + iVar42];
          }
          iVar13 = iVar39 + iVar20;
          if (iVar5 < iVar39 + iVar20) {
            iVar13 = iVar5;
          }
          iVar37 = iVar13 + -1;
          iVar50 = (int)lVar52 + iVar20;
          if (iVar5 <= iVar50) {
            iVar50 = iVar5;
          }
          fVar71 = 0.0;
          if ((0 < iVar18) && (0 < iVar13)) {
            fVar71 = pfVar8[iVar41 * iVar1 + iVar37];
          }
          iVar49 = iVar50 + -1;
          fVar73 = 0.0;
          if ((0 < iVar18) && (0 < iVar50)) {
            fVar73 = pfVar8[iVar41 * iVar1 + iVar49];
          }
          fVar74 = 0.0;
          fVar75 = 0.0;
          if ((0 < iVar46) && (0 < iVar13)) {
            fVar75 = pfVar8[iVar45 * iVar1 + iVar37];
          }
          if ((0 < iVar46) && (0 < iVar50)) {
            fVar74 = pfVar8[iVar45 * iVar1 + iVar49];
          }
          auVar63 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
          in_ZMM16 = ZEXT1664(auVar63);
          if ((0 < iVar16) && (0 < iVar13)) {
            in_ZMM16 = ZEXT464((uint)pfVar8[iVar48 * iVar1 + iVar37]);
          }
          auVar63 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
          in_ZMM17 = ZEXT1664(auVar63);
          if ((0 < iVar16) && (0 < iVar50)) {
            in_ZMM17 = ZEXT464((uint)pfVar8[iVar48 * iVar1 + iVar49]);
          }
          auVar63 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
          in_ZMM18 = ZEXT1664(auVar63);
          auVar63 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
          in_ZMM19 = ZEXT1664(auVar63);
          if ((0 < iVar59) && (0 < iVar13)) {
            in_ZMM19 = ZEXT464((uint)pfVar8[iVar37 + iVar19 * iVar1]);
          }
          if ((0 < iVar59) && (0 < iVar50)) {
            in_ZMM18 = ZEXT464((uint)pfVar8[iVar49 + iVar19 * iVar1]);
          }
          auVar63 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
          in_ZMM21 = ZEXT1664(auVar63);
          if ((0 < iVar18) && (0 < iVar35)) {
            in_ZMM21 = ZEXT464((uint)pfVar8[iVar41 * iVar1 + iVar32]);
          }
          auVar63 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
          in_ZMM22 = ZEXT1664(auVar63);
          if ((0 < iVar18) && (0 < iVar30)) {
            in_ZMM22 = ZEXT464((uint)pfVar8[iVar41 * iVar1 + iVar42]);
          }
          auVar63 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
          in_ZMM23 = ZEXT1664(auVar63);
          auVar63 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
          in_ZMM24 = ZEXT1664(auVar63);
          if ((0 < iVar46) && (0 < iVar35)) {
            in_ZMM24 = ZEXT464((uint)pfVar8[iVar32 + iVar45 * iVar1]);
          }
          if ((0 < iVar46) && (0 < iVar30)) {
            in_ZMM23 = ZEXT464((uint)pfVar8[iVar42 + iVar45 * iVar1]);
          }
          auVar63 = vmaxss_avx(ZEXT416((uint)(fVar68 + ((fVar69 - fVar67) - fVar70))),
                               ZEXT816(0) << 0x40);
          auVar10 = vmaxss_avx(ZEXT416((uint)(fVar74 + ((fVar71 - fVar73) - fVar75))),
                               ZEXT816(0) << 0x40);
          auVar64 = vsubss_avx512f(in_ZMM16._0_16_,in_ZMM17._0_16_);
          auVar64 = vsubss_avx512f(auVar64,in_ZMM19._0_16_);
          auVar64 = vaddss_avx512f(auVar64,in_ZMM18._0_16_);
          auVar65 = vmaxss_avx512f(auVar64,auVar62);
          auVar64 = vsubss_avx512f(in_ZMM21._0_16_,in_ZMM22._0_16_);
          auVar64 = vsubss_avx512f(auVar64,in_ZMM24._0_16_);
          auVar64 = vaddss_avx512f(auVar64,in_ZMM23._0_16_);
          auVar64 = vmaxss_avx(auVar64,ZEXT816(0) << 0x40);
          fVar69 = fVar66 * auVar9._0_4_;
          fVar67 = fVar66 * auVar72._0_4_;
          fVar70 = fVar66 * (((auVar63._0_4_ + auVar10._0_4_) - auVar65._0_4_) - auVar64._0_4_);
          auVar72 = vfmadd231ss_fma(ZEXT416((uint)(fVar70 * fVar70 * -0.81)),ZEXT416((uint)fVar69),
                                    ZEXT416((uint)fVar67));
          *pfVar31 = auVar72._0_4_;
          *pbVar55 = 0.0 <= fVar67 + fVar69;
          pfVar31 = pfVar31 + 1;
          pbVar55 = pbVar55 + 1;
          iVar27 = iVar27 + iVar2;
          lVar52 = lVar52 + lVar25;
          iVar61 = iVar61 + iVar2;
          iVar34 = iVar34 + iVar2;
          iVar54 = iVar54 + iVar2;
          iVar51 = iVar51 + iVar2;
          iVar39 = iVar39 + iVar2;
          iVar60 = iVar60 + iVar2;
          iVar44 = iVar44 + iVar2;
        } while (lVar33 + lVar52 <= (long)iVar58);
      }
      local_110 = local_110 + lVar25;
      iVar43 = iVar43 + iVar1 * iVar2;
      local_1e0 = local_1e0 + lVar25 * lVar24;
      iVar21 = iVar21 + iVar1 * iVar2;
    } while ((long)local_110 <= (long)(int)uVar12);
  }
  if (iVar14 <= iVar26) {
    iVar46 = iVar4 * iVar2 - iVar11;
    lVar52 = (long)iVar20;
    lVar33 = (long)iVar11;
    lVar56 = (long)iVar26;
    iVar43 = ((iVar15 + iVar11 + ~uVar29) - uVar12) * iVar1;
    iVar16 = iVar2 * iVar1;
    iVar58 = ((~uVar29 + iVar15) - uVar12) * iVar1;
    local_1c0 = pfVar8 + ((((iVar15 + lVar56) - (long)(int)uVar29) * lVar24 + lVar52) - lVar33);
    local_f0 = (ulong)iVar14;
    iVar15 = iVar11 + -1 + iVar43;
    iVar21 = iVar11 + -1 + iVar58;
    auVar62 = vxorps_avx512vl(auVar62,auVar62);
    do {
      if (iVar20 <= iVar46) {
        iVar17 = (int)local_f0;
        iVar47 = (int)((long)((ulong)(uint)(iVar17 >> 0x1f) << 0x20 | local_f0 & 0xffffffff) /
                      (long)iVar2) * iVar4 + iVar28;
        iVar60 = iVar17 - iVar11;
        iVar40 = iimage->height;
        iVar44 = iVar60 + 1;
        if (iVar40 < iVar60 + 1) {
          iVar44 = iVar40;
        }
        iVar59 = iVar44 + -1;
        iVar36 = iVar11 * 2 + iVar60;
        if (iVar40 <= iVar36) {
          iVar36 = iVar40;
        }
        iVar48 = iVar36 + -1;
        if (iVar40 < iVar60) {
          iVar60 = iVar40;
        }
        iVar19 = iVar60 + -1;
        iVar18 = iVar40;
        if (iVar17 < iVar40) {
          iVar18 = iVar17;
        }
        iVar51 = iVar18 + -1;
        iVar54 = iVar17 + 1;
        if (iVar40 < iVar17 + 1) {
          iVar54 = iVar40;
        }
        iVar17 = iVar11 + 1 + iVar17;
        if (iVar17 < iVar40) {
          iVar40 = iVar17;
        }
        iVar30 = iVar54 + -1;
        iVar32 = iVar40 + -1;
        pfVar31 = pfVar6 + iVar47;
        pbVar55 = pbVar7 + iVar47;
        lVar57 = 0;
        iVar35 = iVar11 + 1;
        iVar47 = iVar15;
        iVar17 = iVar21;
        iVar27 = iVar3 - iVar26;
        iVar39 = iVar11 + -1;
        iVar34 = -iVar26;
        iVar61 = -uVar12;
        iVar41 = iVar11 - uVar12;
        iVar45 = -iVar11;
        do {
          iVar42 = iVar20 + iVar34;
          if (iVar5 < iVar20 + iVar34) {
            iVar42 = iVar5;
          }
          iVar13 = iVar20 + iVar27;
          if (iVar5 <= iVar20 + iVar27) {
            iVar13 = iVar5;
          }
          auVar72 = vfmadd132ss_fma(ZEXT416((uint)((pfVar8[(lVar52 + iVar58 + lVar57) - lVar33] -
                                                   pfVar8[(lVar52 + iVar43 + lVar57) - lVar33]) +
                                                  (pfVar8[iVar20 + iVar47] - pfVar8[iVar20 + iVar17]
                                                  ))),
                                    ZEXT416((uint)(pfVar8[(lVar56 + local_f0) * lVar24 +
                                                          (long)(iVar20 + iVar39)] -
                                                  local_1c0[lVar57])),SUB6416(ZEXT464(0xc0400000),0)
                                   );
          fVar67 = 0.0;
          fVar69 = 0.0;
          if ((0 < iVar44) && (fVar69 = 0.0, 0 < iVar42)) {
            fVar69 = pfVar8[iVar59 * iVar1 + iVar42 + -1];
          }
          if ((0 < iVar44) && (0 < iVar13)) {
            fVar67 = pfVar8[iVar59 * iVar1 + iVar13 + -1];
          }
          fVar68 = 0.0;
          fVar70 = 0.0;
          if ((0 < iVar36) && (0 < iVar42)) {
            fVar70 = pfVar8[iVar42 + -1 + iVar48 * iVar1];
          }
          if ((0 < iVar36) && (0 < iVar13)) {
            fVar68 = pfVar8[iVar13 + -1 + iVar48 * iVar1];
          }
          iVar42 = iVar20 + iVar61;
          if (iVar5 < iVar20 + iVar61) {
            iVar42 = iVar5;
          }
          iVar13 = iVar41 + iVar20;
          if (iVar5 <= iVar41 + iVar20) {
            iVar13 = iVar5;
          }
          fVar71 = 0.0;
          if ((0 < iVar44) && (0 < iVar42)) {
            fVar71 = pfVar8[iVar59 * iVar1 + iVar42 + -1];
          }
          fVar73 = 0.0;
          if ((0 < iVar44) && (0 < iVar13)) {
            fVar73 = pfVar8[iVar59 * iVar1 + iVar13 + -1];
          }
          fVar74 = 0.0;
          fVar75 = 0.0;
          if ((0 < iVar36) && (0 < iVar42)) {
            fVar75 = pfVar8[iVar42 + -1 + iVar48 * iVar1];
          }
          if ((0 < iVar36) && (0 < iVar13)) {
            fVar74 = pfVar8[iVar13 + -1 + iVar48 * iVar1];
          }
          auVar9 = vmaxss_avx(ZEXT416((uint)(((fVar69 - fVar67) - fVar70) + fVar68)),
                              ZEXT816(0) << 0x40);
          iVar42 = iVar20 + 1 + (int)lVar57;
          if (iVar5 < iVar42) {
            iVar42 = iVar5;
          }
          iVar50 = iVar42 + -1;
          iVar13 = iVar20 + iVar35;
          if (iVar5 <= iVar20 + iVar35) {
            iVar13 = iVar5;
          }
          fVar67 = 0.0;
          auVar63 = vmaxss_avx(ZEXT416((uint)(fVar74 + ((fVar71 - fVar73) - fVar75))),
                               ZEXT816(0) << 0x40);
          auVar9 = vfmadd132ss_fma(auVar63,auVar9,SUB6416(ZEXT464(0xc0400000),0));
          fVar69 = 0.0;
          if ((0 < iVar60) && (0 < iVar42)) {
            fVar69 = pfVar8[iVar19 * iVar1 + iVar50];
          }
          iVar37 = iVar13 + -1;
          if ((0 < iVar60) && (0 < iVar13)) {
            fVar67 = pfVar8[iVar19 * iVar1 + iVar37];
          }
          fVar68 = 0.0;
          fVar70 = 0.0;
          if ((0 < iVar18) && (0 < iVar42)) {
            fVar70 = pfVar8[iVar51 * iVar1 + iVar50];
          }
          if ((0 < iVar18) && (0 < iVar13)) {
            fVar68 = pfVar8[iVar51 * iVar1 + iVar37];
          }
          iVar49 = iVar20 + iVar45;
          if (iVar5 < iVar20 + iVar45) {
            iVar49 = iVar5;
          }
          iVar38 = iVar49 + -1;
          iVar22 = (int)lVar57 + iVar20;
          if (iVar5 <= iVar22) {
            iVar22 = iVar5;
          }
          fVar71 = 0.0;
          if ((0 < iVar54) && (0 < iVar49)) {
            fVar71 = pfVar8[iVar30 * iVar1 + iVar38];
          }
          iVar53 = iVar22 + -1;
          fVar73 = 0.0;
          if ((0 < iVar54) && (0 < iVar22)) {
            fVar73 = pfVar8[iVar30 * iVar1 + iVar53];
          }
          fVar74 = 0.0;
          fVar75 = 0.0;
          if ((0 < iVar40) && (0 < iVar49)) {
            fVar75 = pfVar8[iVar32 * iVar1 + iVar38];
          }
          if ((0 < iVar40) && (0 < iVar22)) {
            fVar74 = pfVar8[iVar32 * iVar1 + iVar53];
          }
          auVar63 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
          in_ZMM16 = ZEXT1664(auVar63);
          if ((0 < iVar60) && (0 < iVar49)) {
            in_ZMM16 = ZEXT464((uint)pfVar8[iVar19 * iVar1 + iVar38]);
          }
          auVar63 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
          in_ZMM17 = ZEXT1664(auVar63);
          if ((0 < iVar60) && (0 < iVar22)) {
            in_ZMM17 = ZEXT464((uint)pfVar8[iVar19 * iVar1 + iVar53]);
          }
          auVar63 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
          in_ZMM18 = ZEXT1664(auVar63);
          auVar63 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
          in_ZMM19 = ZEXT1664(auVar63);
          if ((0 < iVar18) && (0 < iVar49)) {
            in_ZMM19 = ZEXT464((uint)pfVar8[iVar38 + iVar51 * iVar1]);
          }
          if ((0 < iVar18) && (0 < iVar22)) {
            in_ZMM18 = ZEXT464((uint)pfVar8[iVar53 + iVar51 * iVar1]);
          }
          auVar63 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
          in_ZMM21 = ZEXT1664(auVar63);
          if ((0 < iVar54) && (0 < iVar42)) {
            in_ZMM21 = ZEXT464((uint)pfVar8[iVar30 * iVar1 + iVar50]);
          }
          auVar63 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
          in_ZMM22 = ZEXT1664(auVar63);
          if ((0 < iVar54) && (0 < iVar13)) {
            in_ZMM22 = ZEXT464((uint)pfVar8[iVar30 * iVar1 + iVar37]);
          }
          auVar63 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
          in_ZMM23 = ZEXT1664(auVar63);
          auVar63 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
          in_ZMM24 = ZEXT1664(auVar63);
          if ((0 < iVar40) && (0 < iVar42)) {
            in_ZMM24 = ZEXT464((uint)pfVar8[iVar50 + iVar32 * iVar1]);
          }
          if ((0 < iVar40) && (0 < iVar13)) {
            in_ZMM23 = ZEXT464((uint)pfVar8[iVar37 + iVar32 * iVar1]);
          }
          auVar63 = vmaxss_avx(ZEXT416((uint)(fVar68 + ((fVar69 - fVar67) - fVar70))),
                               ZEXT816(0) << 0x40);
          auVar10 = vmaxss_avx(ZEXT416((uint)(fVar74 + ((fVar71 - fVar73) - fVar75))),
                               ZEXT816(0) << 0x40);
          auVar64 = vsubss_avx512f(in_ZMM16._0_16_,in_ZMM17._0_16_);
          auVar64 = vsubss_avx512f(auVar64,in_ZMM19._0_16_);
          auVar64 = vaddss_avx512f(auVar64,in_ZMM18._0_16_);
          auVar65 = vmaxss_avx512f(auVar64,auVar62);
          auVar64 = vsubss_avx512f(in_ZMM21._0_16_,in_ZMM22._0_16_);
          auVar64 = vsubss_avx512f(auVar64,in_ZMM24._0_16_);
          auVar64 = vaddss_avx512f(auVar64,in_ZMM23._0_16_);
          auVar64 = vmaxss_avx(auVar64,ZEXT816(0) << 0x40);
          fVar69 = fVar66 * auVar9._0_4_;
          fVar67 = fVar66 * auVar72._0_4_;
          fVar70 = fVar66 * (((auVar63._0_4_ + auVar10._0_4_) - auVar65._0_4_) - auVar64._0_4_);
          auVar72 = vfmadd231ss_fma(ZEXT416((uint)(fVar70 * fVar70 * -0.81)),ZEXT416((uint)fVar69),
                                    ZEXT416((uint)fVar67));
          *pfVar31 = auVar72._0_4_;
          *pbVar55 = 0.0 <= fVar67 + fVar69;
          pfVar31 = pfVar31 + 1;
          pbVar55 = pbVar55 + 1;
          iVar35 = iVar35 + iVar2;
          lVar57 = lVar57 + lVar25;
          iVar41 = iVar41 + iVar2;
          iVar61 = iVar61 + iVar2;
          iVar27 = iVar27 + iVar2;
          iVar34 = iVar34 + iVar2;
          iVar45 = iVar45 + iVar2;
          iVar39 = iVar39 + iVar2;
          iVar47 = iVar47 + iVar2;
          iVar17 = iVar17 + iVar2;
        } while (lVar52 + lVar57 <= (long)iVar46);
      }
      local_f0 = local_f0 + lVar25;
      iVar43 = iVar43 + iVar16;
      iVar58 = iVar58 + iVar16;
      local_1c0 = local_1c0 + lVar25 * lVar24;
      iVar15 = iVar15 + iVar16;
      iVar21 = iVar21 + iVar16;
    } while ((long)local_f0 <= lVar56);
  }
  iVar20 = iVar4 * iVar2;
  iVar15 = ((iVar2 - iVar11) + iVar20) / iVar2;
  iVar28 = iVar15 * iVar2;
  if (-6 < iVar3) {
    lVar33 = (long)iVar28;
    iVar21 = ((iVar11 - uVar12) + -1) * iVar1;
    local_238 = pfVar8 + ((lVar24 * iVar26 + lVar33) - (long)iVar11);
    local_108 = 0;
    auVar62 = vxorps_avx512vl(auVar62,auVar62);
    do {
      if (iVar28 < iVar20) {
        iVar40 = (int)local_108;
        iVar16 = (int)((long)((ulong)(uint)(iVar40 >> 0x1f) << 0x20 | local_108 & 0xffffffff) /
                      (long)iVar2) * iVar4 + iVar15;
        iVar46 = iVar40 - iVar11;
        iVar43 = iimage->height;
        iVar58 = iVar46 + 1;
        if (iVar43 < iVar46 + 1) {
          iVar58 = iVar43;
        }
        iVar60 = iVar58 + -1;
        iVar44 = iVar11 * 2 + iVar46;
        if (iVar43 <= iVar44) {
          iVar44 = iVar43;
        }
        iVar47 = iVar44 + -1;
        if (iVar43 < iVar46) {
          iVar46 = iVar43;
        }
        iVar36 = iVar46 + -1;
        iVar17 = iVar43;
        if (iVar40 < iVar43) {
          iVar17 = iVar40;
        }
        iVar48 = iVar17 + -1;
        iVar59 = iVar40 + 1;
        if (iVar43 < iVar40 + 1) {
          iVar59 = iVar43;
        }
        iVar18 = iVar11 + 1 + iVar40;
        if (iVar18 < iVar43) {
          iVar43 = iVar18;
        }
        iVar18 = iVar59 + -1;
        iVar19 = iVar43 + -1;
        pfVar31 = pfVar6 + iVar16;
        pbVar55 = pbVar7 + iVar16;
        lVar52 = 0;
        iVar16 = iVar28;
        do {
          iVar54 = iVar16 - iVar26;
          if (iVar5 < iVar16 - iVar26) {
            iVar54 = iVar5;
          }
          iVar51 = (iVar3 - iVar26) + iVar16;
          if (iVar5 <= iVar51) {
            iVar51 = iVar5;
          }
          auVar72 = vfmadd132ss_fma(ZEXT416((uint)(pfVar8[(long)(int)((~uVar12 + iVar11 + iVar40) *
                                                                      iVar1 + iVar5) + -1] -
                                                  pfVar8[(lVar33 + iVar21 + lVar52) - (long)iVar11])
                                           ),ZEXT416((uint)(pfVar8[(long)iVar5 +
                                                                   ((long)iVar26 + local_108) *
                                                                   lVar24 + -1] - local_238[lVar52])
                                                    ),SUB6416(ZEXT464(0xc0400000),0));
          fVar67 = 0.0;
          fVar69 = 0.0;
          if ((0 < iVar58) && (0 < iVar54)) {
            fVar69 = pfVar8[iVar60 * iVar1 + iVar54 + -1];
          }
          if ((0 < iVar58) && (0 < iVar51)) {
            fVar67 = pfVar8[iVar60 * iVar1 + iVar51 + -1];
          }
          fVar68 = 0.0;
          fVar70 = 0.0;
          if ((0 < iVar44) && (0 < iVar54)) {
            fVar70 = pfVar8[iVar54 + -1 + iVar47 * iVar1];
          }
          if ((0 < iVar44) && (0 < iVar51)) {
            fVar68 = pfVar8[iVar51 + -1 + iVar47 * iVar1];
          }
          iVar54 = iVar16 - uVar12;
          if (iVar5 < (int)(iVar16 - uVar12)) {
            iVar54 = iVar5;
          }
          iVar51 = (iVar11 - uVar12) + iVar16;
          if (iVar5 <= iVar51) {
            iVar51 = iVar5;
          }
          fVar71 = 0.0;
          if ((0 < iVar58) && (0 < iVar54)) {
            fVar71 = pfVar8[iVar60 * iVar1 + iVar54 + -1];
          }
          fVar73 = 0.0;
          if ((0 < iVar58) && (0 < iVar51)) {
            fVar73 = pfVar8[iVar60 * iVar1 + iVar51 + -1];
          }
          fVar74 = 0.0;
          fVar75 = 0.0;
          if ((0 < iVar44) && (0 < iVar54)) {
            fVar75 = pfVar8[iVar54 + -1 + iVar47 * iVar1];
          }
          if ((0 < iVar44) && (0 < iVar51)) {
            fVar74 = pfVar8[iVar51 + -1 + iVar47 * iVar1];
          }
          auVar9 = vmaxss_avx(ZEXT416((uint)(((fVar69 - fVar67) - fVar70) + fVar68)),
                              ZEXT816(0) << 0x40);
          iVar54 = iVar16 + 1;
          if (iVar5 < iVar16 + 1) {
            iVar54 = iVar5;
          }
          iVar27 = iVar54 + -1;
          iVar51 = iVar16 + 1 + iVar11;
          if (iVar5 <= iVar51) {
            iVar51 = iVar5;
          }
          fVar67 = 0.0;
          auVar63 = vmaxss_avx(ZEXT416((uint)(fVar74 + ((fVar71 - fVar73) - fVar75))),
                               ZEXT816(0) << 0x40);
          auVar9 = vfmadd132ss_fma(auVar63,auVar9,SUB6416(ZEXT464(0xc0400000),0));
          fVar69 = 0.0;
          if ((0 < iVar46) && (0 < iVar54)) {
            fVar69 = pfVar8[iVar36 * iVar1 + iVar27];
          }
          iVar39 = iVar51 + -1;
          if ((0 < iVar46) && (0 < iVar51)) {
            fVar67 = pfVar8[iVar36 * iVar1 + iVar39];
          }
          fVar68 = 0.0;
          fVar70 = 0.0;
          if ((0 < iVar17) && (0 < iVar54)) {
            fVar70 = pfVar8[iVar48 * iVar1 + iVar27];
          }
          if ((0 < iVar17) && (0 < iVar51)) {
            fVar68 = pfVar8[iVar48 * iVar1 + iVar39];
          }
          iVar34 = iVar16 - iVar11;
          if (iVar5 < iVar16 - iVar11) {
            iVar34 = iVar5;
          }
          iVar41 = iVar34 + -1;
          iVar61 = iVar5;
          if (iVar16 < iVar5) {
            iVar61 = iVar16;
          }
          fVar71 = 0.0;
          if ((0 < iVar59) && (0 < iVar34)) {
            fVar71 = pfVar8[iVar18 * iVar1 + iVar41];
          }
          iVar45 = iVar61 + -1;
          fVar73 = 0.0;
          if ((0 < iVar59) && (0 < iVar61)) {
            fVar73 = pfVar8[iVar18 * iVar1 + iVar45];
          }
          fVar74 = 0.0;
          fVar75 = 0.0;
          if ((0 < iVar43) && (0 < iVar34)) {
            fVar75 = pfVar8[iVar19 * iVar1 + iVar41];
          }
          if ((0 < iVar43) && (0 < iVar61)) {
            fVar74 = pfVar8[iVar19 * iVar1 + iVar45];
          }
          auVar63 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
          in_ZMM16 = ZEXT1664(auVar63);
          if ((0 < iVar46) && (0 < iVar34)) {
            in_ZMM16 = ZEXT464((uint)pfVar8[iVar36 * iVar1 + iVar41]);
          }
          auVar63 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
          in_ZMM17 = ZEXT1664(auVar63);
          if ((0 < iVar46) && (0 < iVar61)) {
            in_ZMM17 = ZEXT464((uint)pfVar8[iVar36 * iVar1 + iVar45]);
          }
          auVar63 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
          in_ZMM18 = ZEXT1664(auVar63);
          auVar63 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
          in_ZMM19 = ZEXT1664(auVar63);
          if ((0 < iVar17) && (0 < iVar34)) {
            in_ZMM19 = ZEXT464((uint)pfVar8[iVar41 + iVar48 * iVar1]);
          }
          if ((0 < iVar17) && (0 < iVar61)) {
            in_ZMM18 = ZEXT464((uint)pfVar8[iVar45 + iVar48 * iVar1]);
          }
          auVar63 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
          in_ZMM21 = ZEXT1664(auVar63);
          if ((0 < iVar59) && (0 < iVar54)) {
            in_ZMM21 = ZEXT464((uint)pfVar8[iVar18 * iVar1 + iVar27]);
          }
          auVar63 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
          in_ZMM22 = ZEXT1664(auVar63);
          if ((0 < iVar59) && (0 < iVar51)) {
            in_ZMM22 = ZEXT464((uint)pfVar8[iVar18 * iVar1 + iVar39]);
          }
          auVar63 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
          in_ZMM23 = ZEXT1664(auVar63);
          auVar63 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
          in_ZMM24 = ZEXT1664(auVar63);
          if ((0 < iVar43) && (0 < iVar54)) {
            in_ZMM24 = ZEXT464((uint)pfVar8[iVar27 + iVar19 * iVar1]);
          }
          if ((0 < iVar43) && (0 < iVar51)) {
            in_ZMM23 = ZEXT464((uint)pfVar8[iVar39 + iVar19 * iVar1]);
          }
          auVar63 = vmaxss_avx(ZEXT416((uint)(fVar68 + ((fVar69 - fVar67) - fVar70))),
                               ZEXT816(0) << 0x40);
          auVar10 = vmaxss_avx(ZEXT416((uint)(fVar74 + ((fVar71 - fVar73) - fVar75))),
                               ZEXT816(0) << 0x40);
          auVar64 = vsubss_avx512f(in_ZMM16._0_16_,in_ZMM17._0_16_);
          auVar64 = vsubss_avx512f(auVar64,in_ZMM19._0_16_);
          auVar64 = vaddss_avx512f(auVar64,in_ZMM18._0_16_);
          auVar65 = vmaxss_avx512f(auVar64,auVar62);
          auVar64 = vsubss_avx512f(in_ZMM21._0_16_,in_ZMM22._0_16_);
          auVar64 = vsubss_avx512f(auVar64,in_ZMM24._0_16_);
          auVar64 = vaddss_avx512f(auVar64,in_ZMM23._0_16_);
          auVar64 = vmaxss_avx(auVar64,ZEXT816(0) << 0x40);
          fVar69 = fVar66 * auVar9._0_4_;
          fVar67 = fVar66 * auVar72._0_4_;
          fVar70 = fVar66 * (((auVar63._0_4_ + auVar10._0_4_) - auVar65._0_4_) - auVar64._0_4_);
          auVar72 = vfmadd231ss_fma(ZEXT416((uint)(fVar70 * fVar70 * -0.81)),ZEXT416((uint)fVar69),
                                    ZEXT416((uint)fVar67));
          *pfVar31 = auVar72._0_4_;
          *pbVar55 = 0.0 <= fVar67 + fVar69;
          pfVar31 = pfVar31 + 1;
          pbVar55 = pbVar55 + 1;
          iVar16 = iVar16 + iVar2;
          lVar52 = lVar52 + lVar25;
        } while (lVar33 + lVar52 < (long)iVar20);
      }
      local_108 = local_108 + lVar25;
      iVar21 = iVar21 + iVar2 * iVar1;
      local_238 = local_238 + lVar25 * lVar24;
    } while ((long)local_108 <= (long)(int)uVar12);
  }
  if (iVar14 <= iVar26) {
    auVar62 = vxorps_avx512vl(auVar62,auVar62);
    do {
      if (iVar28 < iVar20) {
        iVar46 = iVar14 - uVar12;
        iVar58 = iVar14 - iVar11;
        iVar21 = iimage->height;
        iVar43 = iVar58 + 1;
        if (iVar21 < iVar58 + 1) {
          iVar43 = iVar21;
        }
        iVar40 = iVar43 + -1;
        iVar16 = iVar58 + iVar11 * 2;
        if (iVar21 <= iVar16) {
          iVar16 = iVar21;
        }
        iVar60 = iVar16 + -1;
        iVar47 = iVar14 - iVar26;
        iVar44 = iVar47;
        if (iVar21 < iVar47) {
          iVar44 = iVar21;
        }
        iVar17 = iVar47 + iVar3;
        if (iVar21 <= iVar47 + iVar3) {
          iVar17 = iVar21;
        }
        iVar47 = iVar46;
        if (iVar21 < iVar46) {
          iVar47 = iVar21;
        }
        iVar36 = iVar46 + iVar11;
        if (iVar21 <= iVar46 + iVar11) {
          iVar36 = iVar21;
        }
        if (iVar21 < iVar58) {
          iVar58 = iVar21;
        }
        iVar46 = iVar21;
        if (iVar14 < iVar21) {
          iVar46 = iVar14;
        }
        iVar48 = iVar58 + -1;
        iVar18 = iVar46 + -1;
        iVar59 = iVar14 + 1;
        if (iVar21 < iVar14 + 1) {
          iVar59 = iVar21;
        }
        iVar19 = iVar14 + 1 + iVar11;
        if (iVar19 < iVar21) {
          iVar21 = iVar19;
        }
        iVar54 = iVar59 + -1;
        iVar51 = iVar21 + -1;
        lVar24 = (long)((iVar14 / iVar2) * iVar4 + iVar15);
        iVar19 = iVar28;
        do {
          iVar27 = iVar19 - iVar26;
          if (iVar5 < iVar19 - iVar26) {
            iVar27 = iVar5;
          }
          iVar39 = (iVar3 - iVar26) + iVar19;
          if (iVar5 <= iVar39) {
            iVar39 = iVar5;
          }
          fVar67 = 0.0;
          fVar69 = 0.0;
          if ((0 < iVar43) && (0 < iVar27)) {
            fVar69 = pfVar8[iVar40 * iVar1 + iVar27 + -1];
          }
          if ((0 < iVar43) && (0 < iVar39)) {
            fVar67 = pfVar8[iVar40 * iVar1 + iVar39 + -1];
          }
          fVar68 = 0.0;
          fVar70 = 0.0;
          if ((0 < iVar16) && (0 < iVar27)) {
            fVar70 = pfVar8[iVar27 + -1 + iVar60 * iVar1];
          }
          if ((0 < iVar16) && (0 < iVar39)) {
            fVar68 = pfVar8[iVar39 + -1 + iVar60 * iVar1];
          }
          iVar27 = iVar19 - uVar12;
          if (iVar5 < (int)(iVar19 - uVar12)) {
            iVar27 = iVar5;
          }
          iVar39 = (iVar11 - uVar12) + iVar19;
          if (iVar5 <= iVar39) {
            iVar39 = iVar5;
          }
          auVar72 = ZEXT816(0) << 0x40;
          fVar71 = 0.0;
          if ((0 < iVar43) && (0 < iVar27)) {
            fVar71 = pfVar8[iVar40 * iVar1 + iVar27 + -1];
          }
          fVar73 = 0.0;
          if ((0 < iVar43) && (0 < iVar39)) {
            fVar73 = pfVar8[iVar40 * iVar1 + iVar39 + -1];
          }
          fVar74 = 0.0;
          fVar75 = 0.0;
          if ((0 < iVar16) && (0 < iVar27)) {
            fVar75 = pfVar8[iVar27 + -1 + iVar60 * iVar1];
          }
          if ((0 < iVar16) && (0 < iVar39)) {
            fVar74 = pfVar8[iVar39 + -1 + iVar60 * iVar1];
          }
          auVar9 = vmaxss_avx(ZEXT416((uint)(((fVar69 - fVar67) - fVar70) + fVar68)),auVar72);
          iVar27 = -iVar11 + 1 + iVar19;
          if (iVar5 < iVar27) {
            iVar27 = iVar5;
          }
          iVar34 = iVar27 + -1;
          iVar39 = iVar11 + iVar19;
          if (iVar5 <= iVar11 + iVar19) {
            iVar39 = iVar5;
          }
          fVar67 = 0.0;
          auVar63 = vmaxss_avx(ZEXT416((uint)(fVar74 + ((fVar71 - fVar73) - fVar75))),
                               ZEXT816(0) << 0x40);
          auVar9 = vfmadd132ss_fma(auVar63,auVar9,SUB6416(ZEXT464(0xc0400000),0));
          fVar69 = 0.0;
          if ((0 < iVar44) && (0 < iVar27)) {
            fVar69 = pfVar8[(iVar44 + -1) * iVar1 + iVar34];
          }
          iVar61 = iVar39 + -1;
          if ((0 < iVar44) && (0 < iVar39)) {
            fVar67 = pfVar8[(iVar44 + -1) * iVar1 + iVar61];
          }
          fVar68 = 0.0;
          fVar70 = 0.0;
          if ((0 < iVar17) && (0 < iVar27)) {
            fVar70 = pfVar8[(iVar17 + -1) * iVar1 + iVar34];
          }
          if ((0 < iVar17) && (0 < iVar39)) {
            fVar68 = pfVar8[(iVar17 + -1) * iVar1 + iVar61];
          }
          if ((0 < iVar47) && (0 < iVar27)) {
            auVar72 = ZEXT416((uint)pfVar8[(iVar47 + -1) * iVar1 + iVar34]);
          }
          fVar71 = 0.0;
          if ((0 < iVar47) && (0 < iVar39)) {
            fVar71 = pfVar8[(iVar47 + -1) * iVar1 + iVar61];
          }
          fVar75 = 0.0;
          fVar73 = 0.0;
          if ((0 < iVar36) && (0 < iVar27)) {
            fVar73 = pfVar8[iVar34 + (iVar36 + -1) * iVar1];
          }
          if ((0 < iVar36) && (0 < iVar39)) {
            fVar75 = pfVar8[iVar61 + (iVar36 + -1) * iVar1];
          }
          auVar63 = vmaxss_avx(ZEXT416((uint)(((fVar69 - fVar67) - fVar70) + fVar68)),
                               ZEXT816(0) << 0x40);
          iVar27 = iVar19 + 1;
          if (iVar5 < iVar19 + 1) {
            iVar27 = iVar5;
          }
          iVar34 = iVar27 + -1;
          iVar39 = iVar19 + 1 + iVar11;
          if (iVar5 <= iVar39) {
            iVar39 = iVar5;
          }
          fVar67 = 0.0;
          auVar72 = vmaxss_avx(ZEXT416((uint)(fVar75 + ((auVar72._0_4_ - fVar71) - fVar73))),
                               ZEXT816(0) << 0x40);
          auVar72 = vfmadd132ss_fma(auVar72,auVar63,SUB6416(ZEXT464(0xc0400000),0));
          fVar69 = 0.0;
          if ((0 < iVar58) && (0 < iVar27)) {
            fVar69 = pfVar8[iVar48 * iVar1 + iVar34];
          }
          iVar61 = iVar39 + -1;
          if ((0 < iVar58) && (0 < iVar39)) {
            fVar67 = pfVar8[iVar48 * iVar1 + iVar61];
          }
          fVar68 = 0.0;
          fVar70 = 0.0;
          if ((0 < iVar46) && (0 < iVar27)) {
            fVar70 = pfVar8[iVar18 * iVar1 + iVar34];
          }
          if ((0 < iVar46) && (0 < iVar39)) {
            fVar68 = pfVar8[iVar18 * iVar1 + iVar61];
          }
          iVar41 = -iVar11 + iVar19;
          if (iVar5 < iVar41) {
            iVar41 = iVar5;
          }
          iVar35 = iVar41 + -1;
          iVar45 = iVar5;
          if (iVar19 < iVar5) {
            iVar45 = iVar19;
          }
          fVar71 = 0.0;
          if ((0 < iVar59) && (0 < iVar41)) {
            fVar71 = pfVar8[iVar54 * iVar1 + iVar35];
          }
          iVar30 = iVar45 + -1;
          fVar73 = 0.0;
          if ((0 < iVar59) && (0 < iVar45)) {
            fVar73 = pfVar8[iVar54 * iVar1 + iVar30];
          }
          fVar74 = 0.0;
          fVar75 = 0.0;
          if ((0 < iVar21) && (0 < iVar41)) {
            fVar75 = pfVar8[iVar51 * iVar1 + iVar35];
          }
          if ((0 < iVar21) && (0 < iVar45)) {
            fVar74 = pfVar8[iVar51 * iVar1 + iVar30];
          }
          auVar63 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
          in_ZMM16 = ZEXT1664(auVar63);
          if ((0 < iVar58) && (0 < iVar41)) {
            in_ZMM16 = ZEXT464((uint)pfVar8[iVar48 * iVar1 + iVar35]);
          }
          auVar63 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
          in_ZMM17 = ZEXT1664(auVar63);
          if ((0 < iVar58) && (0 < iVar45)) {
            in_ZMM17 = ZEXT464((uint)pfVar8[iVar48 * iVar1 + iVar30]);
          }
          auVar63 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
          in_ZMM18 = ZEXT1664(auVar63);
          auVar63 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
          in_ZMM19 = ZEXT1664(auVar63);
          if ((0 < iVar46) && (0 < iVar41)) {
            in_ZMM19 = ZEXT464((uint)pfVar8[iVar35 + iVar18 * iVar1]);
          }
          if ((0 < iVar46) && (0 < iVar45)) {
            in_ZMM18 = ZEXT464((uint)pfVar8[iVar30 + iVar18 * iVar1]);
          }
          auVar63 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
          in_ZMM21 = ZEXT1664(auVar63);
          if ((0 < iVar59) && (0 < iVar27)) {
            in_ZMM21 = ZEXT464((uint)pfVar8[iVar54 * iVar1 + iVar34]);
          }
          auVar63 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
          in_ZMM22 = ZEXT1664(auVar63);
          if ((0 < iVar59) && (0 < iVar39)) {
            in_ZMM22 = ZEXT464((uint)pfVar8[iVar54 * iVar1 + iVar61]);
          }
          auVar63 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
          in_ZMM23 = ZEXT1664(auVar63);
          auVar63 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
          in_ZMM24 = ZEXT1664(auVar63);
          if ((0 < iVar21) && (0 < iVar27)) {
            in_ZMM24 = ZEXT464((uint)pfVar8[iVar34 + iVar51 * iVar1]);
          }
          if ((0 < iVar21) && (0 < iVar39)) {
            in_ZMM23 = ZEXT464((uint)pfVar8[iVar61 + iVar51 * iVar1]);
          }
          auVar63 = vmaxss_avx(ZEXT416((uint)(fVar68 + ((fVar69 - fVar67) - fVar70))),
                               ZEXT816(0) << 0x40);
          auVar10 = vmaxss_avx(ZEXT416((uint)(fVar74 + ((fVar71 - fVar73) - fVar75))),
                               ZEXT816(0) << 0x40);
          auVar64 = vsubss_avx512f(in_ZMM16._0_16_,in_ZMM17._0_16_);
          auVar64 = vsubss_avx512f(auVar64,in_ZMM19._0_16_);
          auVar64 = vaddss_avx512f(auVar64,in_ZMM18._0_16_);
          auVar65 = vmaxss_avx512f(auVar64,auVar62);
          auVar64 = vsubss_avx512f(in_ZMM21._0_16_,in_ZMM22._0_16_);
          auVar64 = vsubss_avx512f(auVar64,in_ZMM24._0_16_);
          auVar64 = vaddss_avx512f(auVar64,in_ZMM23._0_16_);
          auVar64 = vmaxss_avx(auVar64,ZEXT816(0) << 0x40);
          fVar69 = fVar66 * auVar9._0_4_;
          fVar67 = fVar66 * auVar72._0_4_;
          fVar70 = fVar66 * (((auVar63._0_4_ + auVar10._0_4_) - auVar65._0_4_) - auVar64._0_4_);
          auVar72 = vfmadd231ss_fma(ZEXT416((uint)(fVar70 * fVar70 * -0.81)),ZEXT416((uint)fVar69),
                                    ZEXT416((uint)fVar67));
          pfVar6[lVar24] = auVar72._0_4_;
          pbVar7[lVar24] = 0.0 <= fVar69 + fVar67;
          lVar24 = lVar24 + 1;
          iVar19 = iVar19 + iVar2;
        } while (iVar19 < iVar20);
      }
      iVar14 = iVar14 + iVar2;
    } while (iVar14 <= iVar26);
  }
  iVar14 = (iVar26 + iVar2) - (iVar26 + iVar2) % iVar2;
  iVar23 = iVar23 * iVar2;
  if (iVar14 < iVar23) {
    auVar62 = vxorps_avx512vl(auVar62,auVar62);
    do {
      if (0 < iVar20) {
        iVar21 = iVar14 - iVar11;
        iVar15 = iimage->height;
        iVar28 = iVar21 + 1;
        if (iVar15 < iVar21 + 1) {
          iVar28 = iVar15;
        }
        iVar58 = iVar28 + -1;
        iVar43 = iVar21 + iVar11 * 2;
        if (iVar15 <= iVar43) {
          iVar43 = iVar15;
        }
        iVar16 = iVar43 + -1;
        iVar40 = iVar14 - iVar26;
        iVar46 = iVar40;
        if (iVar15 < iVar40) {
          iVar46 = iVar15;
        }
        iVar44 = iVar40 + iVar3;
        if (iVar15 <= iVar40 + iVar3) {
          iVar44 = iVar15;
        }
        iVar60 = iVar14 - uVar12;
        iVar40 = iVar60;
        if (iVar15 < iVar60) {
          iVar40 = iVar15;
        }
        iVar47 = iVar60 + iVar11;
        if (iVar15 <= iVar60 + iVar11) {
          iVar47 = iVar15;
        }
        if (iVar15 < iVar21) {
          iVar21 = iVar15;
        }
        iVar60 = iVar15;
        if (iVar14 < iVar15) {
          iVar60 = iVar14;
        }
        iVar36 = iVar21 + -1;
        iVar59 = iVar60 + -1;
        iVar17 = iVar14 + 1;
        if (iVar15 < iVar14 + 1) {
          iVar17 = iVar15;
        }
        iVar48 = iVar14 + 1 + iVar11;
        if (iVar48 < iVar15) {
          iVar15 = iVar48;
        }
        iVar48 = iVar17 + -1;
        iVar18 = iVar15 + -1;
        lVar24 = (long)((iVar14 / iVar2) * iVar4);
        iVar19 = 0;
        do {
          iVar54 = iVar19 - iVar26;
          if (iVar5 < iVar19 - iVar26) {
            iVar54 = iVar5;
          }
          iVar51 = (iVar3 - iVar26) + iVar19;
          if (iVar5 <= iVar51) {
            iVar51 = iVar5;
          }
          fVar67 = 0.0;
          fVar69 = 0.0;
          if ((0 < iVar28) && (0 < iVar54)) {
            fVar69 = pfVar8[iVar58 * iVar1 + iVar54 + -1];
          }
          if ((0 < iVar28) && (0 < iVar51)) {
            fVar67 = pfVar8[iVar58 * iVar1 + iVar51 + -1];
          }
          fVar68 = 0.0;
          fVar70 = 0.0;
          if ((0 < iVar43) && (0 < iVar54)) {
            fVar70 = pfVar8[iVar54 + -1 + iVar16 * iVar1];
          }
          if ((0 < iVar43) && (0 < iVar51)) {
            fVar68 = pfVar8[iVar51 + -1 + iVar16 * iVar1];
          }
          iVar54 = iVar19 - uVar12;
          if (iVar5 < (int)(iVar19 - uVar12)) {
            iVar54 = iVar5;
          }
          iVar51 = (iVar11 - uVar12) + iVar19;
          if (iVar5 <= iVar51) {
            iVar51 = iVar5;
          }
          auVar72 = ZEXT816(0) << 0x40;
          fVar71 = 0.0;
          if ((0 < iVar28) && (0 < iVar54)) {
            fVar71 = pfVar8[iVar58 * iVar1 + iVar54 + -1];
          }
          fVar73 = 0.0;
          if ((0 < iVar28) && (0 < iVar51)) {
            fVar73 = pfVar8[iVar58 * iVar1 + iVar51 + -1];
          }
          fVar74 = 0.0;
          fVar75 = 0.0;
          if ((0 < iVar43) && (0 < iVar54)) {
            fVar75 = pfVar8[iVar54 + -1 + iVar16 * iVar1];
          }
          if ((0 < iVar43) && (0 < iVar51)) {
            fVar74 = pfVar8[iVar51 + -1 + iVar16 * iVar1];
          }
          auVar9 = vmaxss_avx(ZEXT416((uint)(((fVar69 - fVar67) - fVar70) + fVar68)),auVar72);
          iVar54 = -iVar11 + 1 + iVar19;
          if (iVar5 < iVar54) {
            iVar54 = iVar5;
          }
          iVar27 = iVar54 + -1;
          iVar51 = iVar11 + iVar19;
          if (iVar5 <= iVar11 + iVar19) {
            iVar51 = iVar5;
          }
          fVar67 = 0.0;
          auVar63 = vmaxss_avx(ZEXT416((uint)(fVar74 + ((fVar71 - fVar73) - fVar75))),
                               ZEXT816(0) << 0x40);
          auVar9 = vfmadd132ss_fma(auVar63,auVar9,SUB6416(ZEXT464(0xc0400000),0));
          fVar69 = 0.0;
          if ((0 < iVar46) && (0 < iVar54)) {
            fVar69 = pfVar8[(iVar46 + -1) * iVar1 + iVar27];
          }
          iVar39 = iVar51 + -1;
          if ((0 < iVar46) && (0 < iVar51)) {
            fVar67 = pfVar8[(iVar46 + -1) * iVar1 + iVar39];
          }
          fVar68 = 0.0;
          fVar70 = 0.0;
          if ((0 < iVar44) && (0 < iVar54)) {
            fVar70 = pfVar8[(iVar44 + -1) * iVar1 + iVar27];
          }
          if ((0 < iVar44) && (0 < iVar51)) {
            fVar68 = pfVar8[(iVar44 + -1) * iVar1 + iVar39];
          }
          if ((0 < iVar40) && (0 < iVar54)) {
            auVar72 = ZEXT416((uint)pfVar8[(iVar40 + -1) * iVar1 + iVar27]);
          }
          fVar71 = 0.0;
          if ((0 < iVar40) && (0 < iVar51)) {
            fVar71 = pfVar8[(iVar40 + -1) * iVar1 + iVar39];
          }
          fVar75 = 0.0;
          fVar73 = 0.0;
          if ((0 < iVar47) && (0 < iVar54)) {
            fVar73 = pfVar8[iVar27 + (iVar47 + -1) * iVar1];
          }
          if ((0 < iVar47) && (0 < iVar51)) {
            fVar75 = pfVar8[iVar39 + (iVar47 + -1) * iVar1];
          }
          auVar63 = vmaxss_avx(ZEXT416((uint)(((fVar69 - fVar67) - fVar70) + fVar68)),
                               ZEXT816(0) << 0x40);
          iVar54 = iVar19 + 1;
          if (iVar5 < iVar19 + 1) {
            iVar54 = iVar5;
          }
          iVar27 = iVar54 + -1;
          iVar51 = iVar19 + 1 + iVar11;
          if (iVar5 <= iVar51) {
            iVar51 = iVar5;
          }
          fVar67 = 0.0;
          auVar72 = vmaxss_avx(ZEXT416((uint)(fVar75 + ((auVar72._0_4_ - fVar71) - fVar73))),
                               ZEXT816(0) << 0x40);
          auVar72 = vfmadd132ss_fma(auVar72,auVar63,SUB6416(ZEXT464(0xc0400000),0));
          fVar69 = 0.0;
          if ((0 < iVar21) && (0 < iVar54)) {
            fVar69 = pfVar8[iVar36 * iVar1 + iVar27];
          }
          iVar39 = iVar51 + -1;
          if ((0 < iVar21) && (0 < iVar51)) {
            fVar67 = pfVar8[iVar36 * iVar1 + iVar39];
          }
          fVar68 = 0.0;
          fVar70 = 0.0;
          if ((0 < iVar60) && (0 < iVar54)) {
            fVar70 = pfVar8[iVar59 * iVar1 + iVar27];
          }
          if ((0 < iVar60) && (0 < iVar51)) {
            fVar68 = pfVar8[iVar59 * iVar1 + iVar39];
          }
          iVar34 = -iVar11 + iVar19;
          if (iVar5 < iVar34) {
            iVar34 = iVar5;
          }
          iVar41 = iVar34 + -1;
          iVar61 = iVar5;
          if (iVar19 < iVar5) {
            iVar61 = iVar19;
          }
          fVar71 = 0.0;
          if ((0 < iVar17) && (0 < iVar34)) {
            fVar71 = pfVar8[iVar48 * iVar1 + iVar41];
          }
          iVar45 = iVar61 + -1;
          fVar73 = 0.0;
          if ((0 < iVar17) && (0 < iVar61)) {
            fVar73 = pfVar8[iVar48 * iVar1 + iVar45];
          }
          fVar74 = 0.0;
          fVar75 = 0.0;
          if ((0 < iVar15) && (0 < iVar34)) {
            fVar75 = pfVar8[iVar18 * iVar1 + iVar41];
          }
          if ((0 < iVar15) && (0 < iVar61)) {
            fVar74 = pfVar8[iVar18 * iVar1 + iVar45];
          }
          auVar63 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
          in_ZMM16 = ZEXT1664(auVar63);
          if ((0 < iVar21) && (0 < iVar34)) {
            in_ZMM16 = ZEXT464((uint)pfVar8[iVar36 * iVar1 + iVar41]);
          }
          auVar63 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
          in_ZMM17 = ZEXT1664(auVar63);
          if ((0 < iVar21) && (0 < iVar61)) {
            in_ZMM17 = ZEXT464((uint)pfVar8[iVar36 * iVar1 + iVar45]);
          }
          auVar63 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
          in_ZMM18 = ZEXT1664(auVar63);
          auVar63 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
          in_ZMM19 = ZEXT1664(auVar63);
          if ((0 < iVar60) && (0 < iVar34)) {
            in_ZMM19 = ZEXT464((uint)pfVar8[iVar41 + iVar59 * iVar1]);
          }
          if ((0 < iVar60) && (0 < iVar61)) {
            in_ZMM18 = ZEXT464((uint)pfVar8[iVar45 + iVar59 * iVar1]);
          }
          auVar63 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
          in_ZMM21 = ZEXT1664(auVar63);
          if ((0 < iVar17) && (0 < iVar54)) {
            in_ZMM21 = ZEXT464((uint)pfVar8[iVar48 * iVar1 + iVar27]);
          }
          auVar63 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
          in_ZMM22 = ZEXT1664(auVar63);
          if ((0 < iVar17) && (0 < iVar51)) {
            in_ZMM22 = ZEXT464((uint)pfVar8[iVar48 * iVar1 + iVar39]);
          }
          auVar63 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
          in_ZMM23 = ZEXT1664(auVar63);
          auVar63 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
          in_ZMM24 = ZEXT1664(auVar63);
          if ((0 < iVar15) && (0 < iVar54)) {
            in_ZMM24 = ZEXT464((uint)pfVar8[iVar27 + iVar18 * iVar1]);
          }
          if ((0 < iVar15) && (0 < iVar51)) {
            in_ZMM23 = ZEXT464((uint)pfVar8[iVar39 + iVar18 * iVar1]);
          }
          auVar63 = vmaxss_avx(ZEXT416((uint)(fVar68 + ((fVar69 - fVar67) - fVar70))),
                               ZEXT816(0) << 0x40);
          auVar10 = vmaxss_avx(ZEXT416((uint)(fVar74 + ((fVar71 - fVar73) - fVar75))),
                               ZEXT816(0) << 0x40);
          auVar64 = vsubss_avx512f(in_ZMM16._0_16_,in_ZMM17._0_16_);
          auVar64 = vsubss_avx512f(auVar64,in_ZMM19._0_16_);
          auVar64 = vaddss_avx512f(auVar64,in_ZMM18._0_16_);
          auVar65 = vmaxss_avx512f(auVar64,auVar62);
          auVar64 = vsubss_avx512f(in_ZMM21._0_16_,in_ZMM22._0_16_);
          auVar64 = vsubss_avx512f(auVar64,in_ZMM24._0_16_);
          auVar64 = vaddss_avx512f(auVar64,in_ZMM23._0_16_);
          auVar64 = vmaxss_avx(auVar64,ZEXT816(0) << 0x40);
          fVar69 = fVar66 * auVar9._0_4_;
          fVar67 = fVar66 * auVar72._0_4_;
          fVar70 = fVar66 * (((auVar63._0_4_ + auVar10._0_4_) - auVar65._0_4_) - auVar64._0_4_);
          auVar72 = vfmadd231ss_fma(ZEXT416((uint)(fVar70 * fVar70 * -0.81)),ZEXT416((uint)fVar69),
                                    ZEXT416((uint)fVar67));
          pfVar6[lVar24] = auVar72._0_4_;
          pbVar7[lVar24] = 0.0 <= fVar69 + fVar67;
          lVar24 = lVar24 + 1;
          iVar19 = iVar19 + iVar2;
        } while (iVar19 < iVar20);
      }
      iVar14 = iVar14 + iVar2;
    } while (iVar14 < iVar23);
  }
  return;
}

Assistant:

void compute_response_layer_Dyy_top(struct response_layer* layer, struct integral_image* iimage) {
    /*
        base function: compute_response_layer_Dyy_leftcorner

        optimization:
        - Dyy box filter hand optimized and split into cases
            => here only top cases
    */
    float Dxx, Dyy, Dxy;
    int x, y, k, k0;
    int r00, r01, c00, c01, r10, r11, c10, c11;
    float Dyy0, Dyy1, A, B, C, D, temp0, temp1;

    float* response = layer->response;
    bool* laplacian = layer->laplacian;

    int data_width = iimage->data_width;
    int step = layer->step;
    int filter_size = layer->filter_size;
    int height = layer->height;
    int width = layer->width;

    int lobe = filter_size / 3;
    int border = (filter_size - 1) / 2;
    float inv_area = 1.f / (filter_size*filter_size);

    int ind = 0;  // oder alternativ (i+1)*j

    float *data = (float*) iimage->data;  // brauch hier keinen cast weil es eig float sein sollte
    int iheight = iimage->height;
    int iwidth = iimage->width;

    // Top Left Corner - Case 1: B of neg part outside
    for (int i = 0; i < lobe / 2 + 1; i += step) {  // Inner B is outside, i.e. 0
        ind = (i / step) * width;

        for (int j = 0; j < lobe; j += step) {  // c0 = col - 1 = (y - lobe + 1) -1 < 0
            // Image coordinates
            x = i;
            y = j;

            // Compute Dyy  
            // whole box filter
            r01 = x + border;
            c01 = y + lobe - 1;

            Dyy0 = data[r01 * data_width + c01];

            // neg part box filter
            r10 = x - lobe / 2 - 1;
            r11 = r10 + lobe;  // -1 is already part of r10
            c11 = y + lobe - 1;

            D = data[r11 * data_width + c11];
            Dyy1 = D;

            Dyy = Dyy0 - 3 * Dyy1;

            // Compute Dxx, Dxy
            Dxx = box_integral(iimage, x - lobe + 1, y - border, 2 * lobe - 1, filter_size) -
                  3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2 * lobe - 1, lobe);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe) +
                  box_integral(iimage, x + 1, y - lobe, lobe, lobe) -
                  box_integral(iimage, x - lobe, y - lobe, lobe, lobe) - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }
    }

    // Top Left Corner - Case 2: B of neg part inside
    // initial value has to be rounded up to next bigger step
    k = (lobe / 2 + 1 + step - 1) / step * step;

    for (int i = k; i < border + 1; i += step) {  // Inner B is inside
        ind = (i / step) * width;

        for (int j = 0; j < lobe; j += step) {
            // Image coordinates
            x = i;
            y = j;

            // Compute Dyy
            // whole box filter
            r01 = x + border;
            c01 = y + lobe - 1;

            Dyy0 = data[r01 * data_width + c01];

            // neg part box filter
            r10 = x - lobe / 2 - 1;
            r11 = r10 + lobe;   // -1 is already part of r10
            c11 = y + lobe - 1;

            B = data[r10 * data_width + c11];
            D = data[r11 * data_width + c11];
            Dyy1 = D - B;

            Dyy = Dyy0 - 3 * Dyy1;

            // Compute Dxx, Dxy
            Dxx = box_integral(iimage, x - lobe + 1, y - border, 2 * lobe - 1, filter_size) -
                  3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2 * lobe - 1, lobe);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe) +
                  box_integral(iimage, x + 1, y - lobe, lobe, lobe) -
                  box_integral(iimage, x - lobe, y - lobe, lobe, lobe) - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }
    }

    // Top Mid - Case 1: B of neg part outside
    k0 = (lobe + step - 1) / step * step;  // initial y value to next multiple of step

    for (int i = 0; i < lobe / 2 + 1; i += step) {
        ind = (i / step) * width + (k0 / step);

        for (int j = k0; j < width * step -lobe+1; j += step) {
            // Image coordinates
            x = i;
            y = j;

            // Compute Dyy
            // whole box filter
            // A and B are outside (= 0), C and D inside
            r01 = x + border;
            c00 = y - lobe;
            c01 = y + lobe - 1;

            C = data[r01 * data_width + c00];
            D = data[r01 * data_width + c01];
            Dyy0 = D - C;

            // neg part box filter
            // A and B are outside (= 0), C and D inside
            r10 = x - lobe / 2 - 1;
            r11 = r10 + lobe;   // r10 und r11 kann man vereinfachen
            c10 = y - lobe;
            c11 = y + lobe - 1;

            C = data[r11 * data_width + c10];
            D = data[r11 * data_width + c11];

            Dyy1 = D - C;

            Dyy = Dyy0 - 3*Dyy1;

            // Compute Dxx, Dxy
            Dxx = box_integral(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                    - 3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe)
                    + box_integral(iimage, x + 1, y - lobe, lobe, lobe)
                    - box_integral(iimage, x - lobe, y - lobe, lobe, lobe)
                    - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }
    }

    // Top Mid - Case 2: B of neg part inside
    k = (lobe / 2 + 1 + step - 1) / step * step;  // round initial value to next highest step
    for (int i = k; i < border+1; i += step) {
        ind = (i / step) * width + (k0 / step);

        for (int j = k0; j < width * step -lobe+1; j += step) {
            // Image coordinates
            x = i;
            y = j;

            // Compute Dyy
            // whole box filter
            r01 = x + border;
            c00 = y - lobe;
            c01 = y + lobe - 1;

            C = data[r01 * data_width + c00];
            D = data[r01 * data_width + c01];
            Dyy0 = D - C;

            // neg part box filter
            r10 = x - lobe / 2 - 1;
            r11 = r10 + lobe;
            c10 = y - lobe;
            c11 = y + lobe - 1;

            A = data[r10 * data_width + c10];
            B = data[r10 * data_width + c11];
            C = data[r11 * data_width + c10];
            D = data[r11 * data_width + c11];

            temp0 = A - C;
            temp1 = D - B;
            Dyy1 = temp0 + temp1;

            Dyy = Dyy0 - 3*Dyy1;

            // Compute Dxx, Dxy
            Dxx = box_integral(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                    - 3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe)
                    + box_integral(iimage, x + 1, y - lobe, lobe, lobe)
                    - box_integral(iimage, x - lobe, y - lobe, lobe, lobe)
                    - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }
    }

    // Top Right - Case 1: A of neg part outside
    k0 = (width*step-lobe+1 + step - 1) / step * step;

    for (int i = 0; i < lobe/2+1; i += step) {
        ind = (i / step) * width + (k0 / step);

        for (int j = k0; j < width * step; j += step) {
            // Image coordinates
            x = i;
            y = j;

            // whole filter
            r01 = x + border;
            c00 = y - lobe;

            C = data[r01 * data_width + c00];
            D = data[r01 * data_width + iwidth-1];
            Dyy0 = D - C;

            // neg part box filter
            r10 = x - lobe / 2 - 1;
            r11 = r10 + lobe;
            c10 = y - lobe;

            C = data[r11 * data_width + c10];
            D = data[r11 * data_width + iwidth-1];

            Dyy1 = D - C;

            Dyy = Dyy0 - 3*Dyy1;

            // Compute Dxx, Dxy
            Dxx = box_integral(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                    - 3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe)
                    + box_integral(iimage, x + 1, y - lobe, lobe, lobe)
                    - box_integral(iimage, x - lobe, y - lobe, lobe, lobe)
                    - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }
    }

    // Top Right - Case 2: A of neg part inside
    k = (lobe / 2 + 1 + step - 1) / step * step;

    for (int i = k; i < border+1; i += step) {
        ind = (i / step) * width + (k0 / step);

        for (int j = k0; j < width * step; j += step) {
            // Image coordinates
            x = i;
            y = j;

            // whole filter
            r01 = x + border;
            c00 = y - lobe;

            C = data[r01 * data_width + c00];
            D = data[r01 * data_width + iwidth-1];
            Dyy0 = D - C;

            // neg part box filter
            r10 = x - lobe / 2 - 1;
            r11 = r10 + lobe;
            c10 = y - lobe;

            A = data[r10 * data_width + c10];
            B = data[r10 * data_width + iwidth-1];
            C = data[r11 * data_width + c10];
            D = data[r11 * data_width + iwidth-1];

            temp0 = A - C;
            temp1 = D - B;
            Dyy1 = temp0 + temp1;

            Dyy = Dyy0 - 3*Dyy1;

            // Compute Dxx, Dxy
            Dxx = box_integral(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                    - 3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
            Dyy = box_integral(iimage, x - border, y - lobe + 1, filter_size, 2*lobe - 1)
                    - 3 * box_integral(iimage, x - lobe / 2, y - lobe + 1, lobe, 2*lobe - 1);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe)
                    + box_integral(iimage, x + 1, y - lobe, lobe, lobe)
                    - box_integral(iimage, x - lobe, y - lobe, lobe, lobe)
                    - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }
    }

    // Rest
    k = (border + 1 + step - 1) / step * step;

    for (int i = k; i < height * step; i += step) {
        ind = (i / step) * width;

        for (int j = 0; j < width * step; j += step) {
            // Image coordinates
            x = i;
            y = j;

            // Calculate Dxx, Dyy, Dxy with Box Filter
            Dxx = box_integral(iimage, x - lobe + 1, y - border, 2 * lobe - 1, filter_size) -
                  3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2 * lobe - 1, lobe);
            Dyy = box_integral(iimage, x - border, y - lobe + 1, filter_size, 2 * lobe - 1) -
                  3 * box_integral(iimage, x - lobe / 2, y - lobe + 1, lobe, 2 * lobe - 1);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe) +
                  box_integral(iimage, x + 1, y - lobe, lobe, lobe) -
                  box_integral(iimage, x - lobe, y - lobe, lobe, lobe) - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }
    }
}